

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.h
# Opt level: O1

bool __thiscall
rapidjson::
GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
::Uint64(GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
         *this,uint64_t i)

{
  uint64_t *puVar1;
  
  if ((this->stack_).stackEnd_ <= (this->stack_).stackTop_ + 0x18) {
    internal::Stack<rapidjson::CrtAllocator>::
    Expand<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
              (&this->stack_,1);
  }
  puVar1 = (uint64_t *)(this->stack_).stackTop_;
  (this->stack_).stackTop_ = (char *)(puVar1 + 3);
  *puVar1 = 0;
  puVar1[1] = 0;
  *(undefined4 *)(puVar1 + 2) = 0x2206;
  *puVar1 = i;
  if (-1 < (long)i) {
    *(undefined4 *)(puVar1 + 2) = 0x3206;
  }
  if (i >> 0x20 == 0) {
    *(byte *)((long)puVar1 + 0x11) = *(byte *)((long)puVar1 + 0x11) | 8;
  }
  if (i < 0x80000000) {
    *(byte *)((long)puVar1 + 0x11) = *(byte *)((long)puVar1 + 0x11) | 4;
  }
  return true;
}

Assistant:

bool Uint64(uint64_t i) { new (stack_.template Push<ValueType>()) ValueType(i); return true; }